

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::
make_exception<const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>::
operator()(make_exception<const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
           *this,stringstream *msg,char *arg,fpos<__mbstate_t> args,char *args_1,
          fpos<__mbstate_t> args_2)

{
  make_exception<std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_> local_21;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>::operator()
            (&local_21,msg,args,args_1,args_2);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }